

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O3

void __thiscall proto3_arena_unittest::TestAllTypes::Clear(TestAllTypes *this)

{
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *pRVar2;
  RepeatedField<unsigned_int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  uint uVar5;
  ulong uVar6;
  TestAllTypes_NestedMessage *pTVar7;
  ForeignMessage *this_03;
  ImportMessage *pIVar8;
  PublicImportMessage *this_04;
  anon_union_808_1_493b367e_for_TestAllTypes_12 aVar9;
  int iVar10;
  undefined8 *puVar11;
  char *failure_msg;
  char *file;
  bool bVar12;
  LogMessageFatal local_30;
  
  pRVar1 = &(this->field_0)._impl_.repeated_int32_;
  aVar9 = this->field_0;
  if (((undefined1  [808])aVar9 & (undefined1  [808])0x4) != (undefined1  [808])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = ((undefined1  [808])aVar9 & (undefined1  [808])0x4) == (undefined1  [808])0x0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size
            (pRVar1,((undefined1  [808])aVar9 & (undefined1  [808])0x4) == (undefined1  [808])0x0,0)
  ;
  pRVar2 = &(this->field_0)._impl_.repeated_int64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x28);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar2,(uVar6 & 4) == 0,0);
  pRVar3 = &(this->field_0)._impl_.repeated_uint32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x40);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar3->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(pRVar3,(uVar6 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_uint64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x58);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar4,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_sint32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x70);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar2 = &(this->field_0)._impl_.repeated_sint64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x88);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar2,(uVar6 & 4) == 0,0);
  pRVar3 = &(this->field_0)._impl_.repeated_fixed32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xa0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar3->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(pRVar3,(uVar6 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_fixed64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xb0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar4,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_sfixed32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xc0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar2 = &(this->field_0)._impl_.repeated_sfixed64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xd0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar2,(uVar6 & 4) == 0,0);
  this_00 = &(this->field_0)._impl_.repeated_float_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xe0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  google::protobuf::RepeatedField<float>::set_size(this_00,(uVar6 & 4) == 0,0);
  this_01 = &(this->field_0)._impl_.repeated_double_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xf0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  google::protobuf::RepeatedField<double>::set_size(this_01,(uVar6 & 4) == 0,0);
  this_02 = &(this->field_0)._impl_.repeated_bool_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x100);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  google::protobuf::RepeatedField<bool>::set_size(this_02,(uVar6 & 4) == 0,0);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::TestAllTypes_NestedMessage>>
            (&(this->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::ForeignMessage>>
            (&(this->field_0)._impl_.repeated_foreign_message_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
            (&(this->field_0)._impl_.repeated_import_message_.super_RepeatedPtrFieldBase);
  pRVar1 = &(this->field_0)._impl_.repeated_nested_enum_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x188);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_foreign_enum_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x1a0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar10 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar10 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string_piece_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_cord_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::TestAllTypes_NestedMessage>>
            (&(this->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase);
  uVar5 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) == 0) {
LAB_00cf9da6:
      if ((uVar5 & 2) != 0) {
        uVar6 = *(ulong *)((long)&this->field_0 + 0x208);
        if ((uVar6 & 3) == 0) goto LAB_00cfa028;
        puVar11 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
        puVar11[1] = 0;
        *(undefined1 *)*puVar11 = 0;
      }
      if ((uVar5 & 4) != 0) {
        uVar6 = *(ulong *)((long)&this->field_0 + 0x210);
        if ((uVar6 & 3) == 0) goto LAB_00cfa028;
        puVar11 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
        puVar11[1] = 0;
        *(undefined1 *)*puVar11 = 0;
      }
      if ((uVar5 & 8) != 0) {
        uVar6 = *(ulong *)((long)&this->field_0 + 0x218);
        if ((uVar6 & 3) == 0) goto LAB_00cfa028;
        puVar11 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
        puVar11[1] = 0;
        *(undefined1 *)*puVar11 = 0;
      }
      if ((uVar5 & 0x10) != 0) {
        pTVar7 = (this->field_0)._impl_.optional_nested_message_;
        if (pTVar7 == (TestAllTypes_NestedMessage *)0x0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
          ;
          failure_msg = "_impl_.optional_nested_message_ != nullptr";
          iVar10 = 0x6e5;
          goto LAB_00cfa043;
        }
        TestAllTypes_NestedMessage::Clear(pTVar7);
      }
      if ((uVar5 & 0x20) != 0) {
        this_03 = (this->field_0)._impl_.optional_foreign_message_;
        if (this_03 == (ForeignMessage *)0x0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
          ;
          failure_msg = "_impl_.optional_foreign_message_ != nullptr";
          iVar10 = 0x6e9;
          goto LAB_00cfa043;
        }
        ForeignMessage::Clear(this_03);
      }
      if ((uVar5 & 0x40) != 0) {
        pIVar8 = (this->field_0)._impl_.optional_import_message_;
        if (pIVar8 == (ImportMessage *)0x0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
          ;
          failure_msg = "_impl_.optional_import_message_ != nullptr";
          iVar10 = 0x6ed;
          goto LAB_00cfa043;
        }
        proto2_unittest_import::ImportMessage::Clear(pIVar8);
      }
      if ((char)uVar5 < '\0') {
        this_04 = (this->field_0)._impl_.optional_public_import_message_;
        if (this_04 == (PublicImportMessage *)0x0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
          ;
          failure_msg = "_impl_.optional_public_import_message_ != nullptr";
          iVar10 = 0x6f1;
          goto LAB_00cfa043;
        }
        proto2_unittest_import::PublicImportMessage::Clear(this_04);
      }
      goto LAB_00cf9e86;
    }
    uVar6 = *(ulong *)((long)&this->field_0 + 0x200);
    if ((uVar6 & 3) != 0) {
      puVar11 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
      puVar11[1] = 0;
      *(undefined1 *)*puVar11 = 0;
      goto LAB_00cf9da6;
    }
LAB_00cfa028:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    iVar10 = 0x20b;
LAB_00cfa043:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,file,iVar10,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
LAB_00cf9e86:
  if ((uVar5 & 0x300) != 0) {
    if ((uVar5 >> 8 & 1) != 0) {
      pTVar7 = (this->field_0)._impl_.optional_lazy_message_;
      if (pTVar7 == (TestAllTypes_NestedMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
        ;
        failure_msg = "_impl_.optional_lazy_message_ != nullptr";
        iVar10 = 0x6f7;
        goto LAB_00cfa043;
      }
      TestAllTypes_NestedMessage::Clear(pTVar7);
    }
    if ((uVar5 >> 9 & 1) != 0) {
      pTVar7 = (this->field_0)._impl_.optional_unverified_lazy_message_;
      if (pTVar7 == (TestAllTypes_NestedMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
        ;
        failure_msg = "_impl_.optional_unverified_lazy_message_ != nullptr";
        iVar10 = 0x6fb;
        goto LAB_00cfa043;
      }
      TestAllTypes_NestedMessage::Clear(pTVar7);
    }
  }
  if ((uVar5 & 0xfc00) != 0) {
    (this->field_0)._impl_.optional_uint64_ = 0;
    (this->field_0)._impl_.optional_sint64_ = 0;
    (this->field_0)._impl_.optional_int64_ = 0;
    *(undefined8 *)((long)&this->field_0 + 600) = 0;
    (this->field_0)._impl_.optional_sint32_ = 0;
  }
  if ((uVar5 & 0xff0000) != 0) {
    (this->field_0)._impl_.optional_double_ = 0.0;
    *(undefined8 *)((long)&this->field_0 + 0x298) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.optional_sfixed64_ + 4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28c) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x274) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.optional_fixed64_ + 4) = 0;
  }
  if ((uVar5 & 0x3f000000) == 0) goto LAB_00cf9f99;
  *(undefined8 *)((long)&this->field_0 + 0x2a0) = 0;
  if ((uVar5 >> 0x1a & 1) != 0) {
    absl::lts_20250127::Cord::Clear(&(this->field_0)._impl_.optional_bytes_cord_);
  }
  if ((uVar5 >> 0x1b & 1) != 0) {
    uVar6 = *(ulong *)((long)&this->field_0 + 0x2b8);
    if ((uVar6 & 3) == 0) goto LAB_00cfa028;
    puVar11 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
    puVar11[1] = 0;
    *(undefined1 *)*puVar11 = 0;
  }
  if ((uVar5 >> 0x1c & 1) != 0) {
    uVar6 = *(ulong *)((long)&this->field_0 + 0x2c0);
    if ((uVar6 & 3) == 0) goto LAB_00cfa028;
    puVar11 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
    puVar11[1] = 0;
    *(undefined1 *)*puVar11 = 0;
  }
  if ((uVar5 >> 0x1d & 1) != 0) {
    pIVar8 = (this->field_0)._impl_.optional_lazy_import_message_;
    if (pIVar8 == (ImportMessage *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
      ;
      failure_msg = "_impl_.optional_lazy_import_message_ != nullptr";
      iVar10 = 0x717;
      goto LAB_00cfa043;
    }
    proto2_unittest_import::ImportMessage::Clear(pIVar8);
  }
LAB_00cf9f99:
  if (0x3fffffff < uVar5) {
    (this->field_0)._impl_.proto3_optional_int32_ = 0;
    (this->field_0)._impl_.proto3_optional_int64_ = 0;
  }
  uVar5 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  if ((char)uVar5 != '\0') {
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_fixed64_ + 4) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_sfixed64_ + 4) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_sint64_ + 4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2f4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2dc) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.proto3_optional_uint64_ + 4) = 0;
  }
  if ((uVar5 & 0x300) != 0) {
    *(undefined4 *)((long)&this->field_0 + 0x314) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x30c) = 0;
  }
  clear_oneof_field(this);
  *(undefined8 *)(this->field_0)._impl_._has_bits_.has_bits_ = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_int32_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_uint32_.Clear();
  _impl_.repeated_uint64_.Clear();
  _impl_.repeated_sint32_.Clear();
  _impl_.repeated_sint64_.Clear();
  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_sfixed32_.Clear();
  _impl_.repeated_sfixed64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_double_.Clear();
  _impl_.repeated_bool_.Clear();
  _impl_.repeated_string_.Clear();
  _impl_.repeated_bytes_.Clear();
  _impl_.repeated_nested_message_.Clear();
  _impl_.repeated_foreign_message_.Clear();
  _impl_.repeated_import_message_.Clear();
  _impl_.repeated_nested_enum_.Clear();
  _impl_.repeated_foreign_enum_.Clear();
  _impl_.repeated_string_piece_.Clear();
  _impl_.repeated_cord_.Clear();
  _impl_.repeated_lazy_message_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.optional_string_piece_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.optional_cord_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.optional_nested_message_ != nullptr);
      _impl_.optional_nested_message_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.optional_foreign_message_ != nullptr);
      _impl_.optional_foreign_message_->Clear();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(_impl_.optional_import_message_ != nullptr);
      _impl_.optional_import_message_->Clear();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(_impl_.optional_public_import_message_ != nullptr);
      _impl_.optional_public_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_message_ != nullptr);
      _impl_.optional_lazy_message_->Clear();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(_impl_.optional_unverified_lazy_message_ != nullptr);
      _impl_.optional_unverified_lazy_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000fc00u) != 0) {
    ::memset(&_impl_.optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_sint32_) -
        reinterpret_cast<char*>(&_impl_.optional_int64_)) + sizeof(_impl_.optional_sint32_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.optional_fixed32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_nested_enum_) -
        reinterpret_cast<char*>(&_impl_.optional_fixed32_)) + sizeof(_impl_.optional_nested_enum_));
  }
  if ((cached_has_bits & 0x3f000000u) != 0) {
    ::memset(&_impl_.optional_foreign_enum_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_float_) -
        reinterpret_cast<char*>(&_impl_.optional_foreign_enum_)) + sizeof(_impl_.proto3_optional_float_));
    if ((cached_has_bits & 0x04000000u) != 0) {
      _impl_.optional_bytes_cord_.Clear();
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _impl_.proto3_optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _impl_.proto3_optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_import_message_ != nullptr);
      _impl_.optional_lazy_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0xc0000000u) != 0) {
    ::memset(&_impl_.proto3_optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_int32_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_int64_)) + sizeof(_impl_.proto3_optional_int32_));
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.proto3_optional_uint32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_sfixed32_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_uint32_)) + sizeof(_impl_.proto3_optional_sfixed32_));
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    ::memset(&_impl_.proto3_optional_bool_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_double_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_bool_)) + sizeof(_impl_.proto3_optional_double_));
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}